

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

int __thiscall ValidateFootprint::ScanLine(ValidateFootprint *this)

{
  int iVar1;
  ValidateFootprint *this_local;
  
  iVar1 = __isoc99_sscanf(&this->super_Validate,"%lld,%llu,%d,%f",&this->initialEveID_,
                          &this->initialAreaperilID_,&(this->fr_).super_EventRow.intensity_bin_id,
                          &(this->fr_).super_EventRow.probability);
  return iVar1;
}

Assistant:

int ValidateFootprint::ScanLine() {
/* The probability field is defined according to the data type assigned to
 * OASIS_FLOAT in include/oasis.h */

#ifdef OASIS_FLOAT_TYPE_DOUBLE
  return sscanf(line_, "%lld,%llu,%d,%lf", &initialEveID_, &initialAreaperilID_,
				      &fr_.intensity_bin_id, &fr_.probability);
#else
  return sscanf(line_, "%lld,%llu,%d,%f", &initialEveID_, &initialAreaperilID_,
				      &fr_.intensity_bin_id, &fr_.probability);
#endif

}